

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

BasicBlock * __thiscall spvtools::opt::CFG::SplitLoopHeader(CFG *this,BasicBlock *bb)

{
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar1;
  Function *pFVar2;
  IRContext *pIVar3;
  UptrVector *pUVar4;
  pointer puVar5;
  pointer puVar6;
  CFG *this_00;
  IntrusiveNodeBase<spvtools::opt::Instruction> *this_01;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  Instruction *pIVar10;
  ptrdiff_t pVar11;
  long lVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar13;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var14;
  BasicBlock *blk;
  mapped_type *pmVar15;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __position;
  LoopDescriptor *this_02;
  Loop *pLVar16;
  pointer puVar17;
  pointer puVar18;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_03;
  SmallVector<unsigned_int,_2UL> *that;
  BasicBlock *this_04;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  IRContext *context;
  CFG *local_f0;
  undefined1 local_e8 [16];
  PodType local_d8 [2];
  code *local_d0;
  Op local_b4;
  IRContext *local_b0;
  IntrusiveNodeBase<spvtools::opt::Instruction> *local_a8;
  uint32_t local_9c [3];
  SmallVector<unsigned_int,_2UL> local_90;
  iterator local_68;
  initializer_list<spvtools::opt::Operand> local_60;
  InstructionBuilder branch_builder;
  
  pIVar10 = BasicBlock::GetLoopMergeInst(bb);
  if (pIVar10 == (Instruction *)0x0) {
    __assert_fail("bb->GetLoopMergeInst() && \"Expecting bb to be the header of a loop.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xc1,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  pFVar2 = bb->function_;
  pIVar3 = this->module_->context_;
  context = pIVar3;
  uVar7 = IRContext::TakeNextId(pIVar3);
  if (uVar7 == 0) {
    return (BasicBlock *)0x0;
  }
  pvVar1 = &pFVar2->blocks_;
  local_e8._8_8_ =
       (pFVar2->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_90.size_ =
       (size_t)(pFVar2->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  that = (SmallVector<unsigned_int,_2UL> *)local_e8;
  local_e8._0_8_ = pvVar1;
  local_90._vptr_SmallVector = (_func_int **)pvVar1;
  pVar11 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator-
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&local_90,
                      (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)that);
  puVar17 = (pointer)(local_e8._8_8_ + 0x10);
  local_b0 = pIVar3;
  for (lVar12 = pVar11 >> 2; local_f0 = this, 0 < lVar12; lVar12 = lVar12 + -1) {
    if (puVar17[-2]._M_t.
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb) {
      puVar18 = puVar17 + -2;
      goto LAB_0048aaf4;
    }
    local_e8._8_8_ = puVar17 + -1;
    puVar18 = puVar17 + -1;
    if ((puVar17[-1]._M_t.
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb) ||
       (puVar18 = puVar17,
       (puVar17->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb))
    goto LAB_0048aaf4;
    if (puVar17[1]._M_t.
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb) {
      puVar18 = puVar17 + 1;
      goto LAB_0048aaf4;
    }
    local_e8._8_8_ = puVar17 + 2;
    puVar17 = puVar17 + 4;
  }
  that = (SmallVector<unsigned_int,_2UL> *)local_e8;
  pVar11 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator-
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&local_90,
                      (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)that);
  if (pVar11 == 3) {
    puVar18 = (pointer)local_e8._8_8_;
    if ((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        )*(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
           *)local_e8._8_8_ ==
        (__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        )bb) goto LAB_0048aaf4;
    local_e8._8_8_ = (pointer)(local_e8._8_8_ + 8);
LAB_0048b06a:
    puVar18 = (pointer)local_e8._8_8_;
    if ((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        )*(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
           *)local_e8._8_8_ ==
        (__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        )bb) goto LAB_0048aaf4;
    local_e8._8_8_ = (pointer)(local_e8._8_8_ + 8);
LAB_0048b07c:
    puVar18 = (pointer)local_e8._8_8_;
    if ((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        )*(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
           *)local_e8._8_8_ ==
        (__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        )bb) goto LAB_0048aaf4;
  }
  else {
    if (pVar11 == 2) goto LAB_0048b06a;
    if (pVar11 == 1) goto LAB_0048b07c;
  }
  puVar18 = (pointer)local_90.size_;
  that = &local_90;
LAB_0048aaf4:
  pUVar4 = (UptrVector *)that->_vptr_SmallVector;
  if ((pUVar4 == pvVar1) &&
     (puVar18 ==
      (pFVar2->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("header_it != fn->end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xd1,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  uVar8 = BasicBlock::id(bb);
  pvVar13 = preds(local_f0,uVar8);
  while( true ) {
    if ((pUVar4 == pvVar1) &&
       (puVar17 = puVar18,
       puVar18 ==
       (pFVar2->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0048ab86;
    puVar5 = (pvVar13->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (pvVar13->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = BasicBlock::id((puVar18->_M_t).
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
    local_e8._0_4_ = uVar8;
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                       (puVar5,puVar6,local_e8);
    if (_Var14._M_current !=
        (pvVar13->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    puVar18 = puVar18 + 1;
  }
  puVar17 = (pFVar2->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
LAB_0048ab86:
  pIVar3 = local_b0;
  this_00 = local_f0;
  if ((pUVar4 == pvVar1) && (puVar18 == puVar17)) {
    __assert_fail("latch_block_iter != fn->end() && \"Could not find the latch.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xdf,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  this_04 = (puVar18->_M_t).
            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  RemoveSuccessorEdges(local_f0,bb);
  local_68.super_iterator.node_ =
       (iterator)&(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  do {
    local_68.super_iterator.node_ =
         *(iterator *)
          ((long)&((Instruction *)local_68.super_iterator.node_)->
                  super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
  } while (((Instruction *)local_68.super_iterator.node_)->opcode_ == OpPhi);
  blk = BasicBlock::SplitBasicBlock(bb,pIVar3,uVar7,&local_68);
  IRContext::AnalyzeDefUse
            (pIVar3,(Instruction *)
                    (blk->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>);
  RegisterBlock(this_00,blk);
  IRContext::set_instr_block
            (pIVar3,(Instruction *)
                    (blk->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>,blk);
  local_e8._8_8_ = pIVar3;
  local_d0 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:243:27)>
             ::_M_invoke;
  local_d8 = (PodType  [2])
             std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:243:27)>
             ::_M_manager;
  local_e8._0_8_ = blk;
  BasicBlock::ForEachInst(blk,(function<void_(spvtools::opt::Instruction_*)> *)local_e8,false);
  if (local_d8 != (PodType  [2])0x0) {
    (*(code *)local_d8)(local_e8,local_e8,3);
  }
  if (this_04 == bb) {
    uVar8 = BasicBlock::ContinueBlockId(blk);
    uVar9 = BasicBlock::id(bb);
    this_04 = blk;
    if (uVar8 == uVar9) {
      pIVar10 = BasicBlock::GetLoopMergeInst(blk);
      local_90._vptr_SmallVector = (_func_int **)CONCAT44(local_90._vptr_SmallVector._4_4_,uVar7);
      init_list._M_len = 1;
      init_list._M_array = (iterator)&local_90;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)local_e8,init_list);
      Instruction::SetInOperand(pIVar10,1,(SmallVector<unsigned_int,_2UL> *)local_e8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)local_e8);
    }
  }
  local_e8._8_8_ = 0;
  local_e8._0_8_ = ::operator_new(0x20);
  *(BasicBlock **)local_e8._0_8_ = this_04;
  *(BasicBlock **)(local_e8._0_8_ + 8) = bb;
  *(BasicBlock **)(local_e8._0_8_ + 0x10) = blk;
  *(IRContext **)(local_e8._0_8_ + 0x18) = pIVar3;
  local_d0 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:257:22)>
             ::_M_invoke;
  local_d8 = (PodType  [2])
             std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:257:22)>
             ::_M_manager;
  BasicBlock::ForEachPhiInst(bb,(function<void_(spvtools::opt::Instruction_*)> *)local_e8,false);
  if (local_d8 != (PodType  [2])0x0) {
    (*(code *)local_d8)(local_e8,local_e8,3);
  }
  InstructionBuilder::InstructionBuilder
            (&branch_builder,pIVar3,bb,kAnalysisInstrToBlockMapping|kAnalysisBegin);
  local_b4 = OpBranch;
  local_9c[2] = 0;
  local_9c[1] = 0;
  local_9c[0] = BasicBlock::id(blk);
  init_list_00._M_len = 1;
  init_list_00._M_array = local_9c;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list_00);
  local_e8._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),&local_90);
  local_60._M_len = 1;
  local_60._M_array = (iterator)local_e8;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*&,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_a8,&context,&local_b4,(int *)(local_9c + 2),(int *)(local_9c + 1),
             &local_60);
  this_01 = local_a8;
  local_a8 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            (this_01,&(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
  if (local_a8 != (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0) {
    (**(code **)(*(long *)local_a8 + 8))();
  }
  local_a8 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
  pIVar3 = context;
  pIVar10 = BasicBlock::terminator(bb);
  IRContext::AnalyzeUses(pIVar3,pIVar10);
  pIVar3 = context;
  pIVar10 = BasicBlock::terminator(bb);
  IRContext::set_instr_block(pIVar3,pIVar10,bb);
  this_03 = &local_f0->label2preds_;
  uVar8 = BasicBlock::id(blk);
  local_e8._0_4_ = uVar8;
  pmVar15 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_03,(key_type *)local_e8);
  uVar8 = BasicBlock::id(bb);
  local_90._vptr_SmallVector = (_func_int **)CONCAT44(local_90._vptr_SmallVector._4_4_,uVar8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar15,(uint *)&local_90);
  local_e8._12_4_ = 0;
  local_e8._8_4_ = uVar7;
  local_d0 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:315:38)>
             ::_M_invoke;
  local_d8 = (PodType  [2])
             std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:315:38)>
             ::_M_manager;
  local_e8._0_8_ = bb;
  BasicBlock::ForEachSuccessorLabel(this_04,(function<void_(unsigned_int_*)> *)local_e8);
  if (local_d8 != (PodType  [2])0x0) {
    (*(code *)local_d8)(local_e8,local_e8,3);
  }
  pIVar10 = BasicBlock::terminator(this_04);
  IRContext::AnalyzeUses(context,pIVar10);
  uVar8 = BasicBlock::id(blk);
  local_e8._0_4_ = uVar8;
  pmVar15 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_03,(key_type *)local_e8);
  uVar8 = BasicBlock::id(this_04);
  local_90._vptr_SmallVector = (_func_int **)CONCAT44(local_90._vptr_SmallVector._4_4_,uVar8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar15,(uint *)&local_90);
  local_e8._0_4_ = BasicBlock::id(bb);
  pmVar15 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_03,(key_type *)local_e8);
  puVar5 = (pmVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (pmVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_e8._0_4_ = BasicBlock::id(this_04);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                         (puVar5,puVar6,local_e8);
  if (__position._M_current !=
      (pmVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
              (pmVar15,(const_iterator)__position._M_current);
    if ((context->valid_analyses_ & kAnalysisLoopAnalysis) != kAnalysisNone) {
      this_02 = IRContext::GetLoopDescriptor(context,bb->function_);
      uVar8 = BasicBlock::id(bb);
      pLVar16 = LoopDescriptor::FindLoopForBasicBlock(this_02,uVar8);
      Loop::AddBasicBlock(pLVar16,uVar7);
      pLVar16->loop_header_ = blk;
      LoopDescriptor::SetBasicBlockToLoop(this_02,uVar7,pLVar16);
      uVar7 = BasicBlock::id(bb);
      Loop::RemoveBasicBlock(pLVar16,uVar7);
      Loop::SetPreHeaderBlock(pLVar16,bb);
      pLVar16 = pLVar16->parent_;
      uVar7 = BasicBlock::id(bb);
      if (pLVar16 == (Loop *)0x0) {
        pLVar16 = (Loop *)0x0;
      }
      else {
        Loop::AddBasicBlock(pLVar16,uVar7);
        uVar7 = BasicBlock::id(bb);
      }
      LoopDescriptor::SetBasicBlockToLoop(this_02,uVar7,pLVar16);
    }
    return blk;
  }
  __assert_fail("latch_pos != block_preds.end() && \"The cfg was invalid.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                ,0x147,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
}

Assistant:

BasicBlock* CFG::SplitLoopHeader(BasicBlock* bb) {
  assert(bb->GetLoopMergeInst() && "Expecting bb to be the header of a loop.");

  Function* fn = bb->GetParent();
  IRContext* context = module_->context();

  // Get the new header id up front.  If we are out of ids, then we cannot split
  // the loop.
  uint32_t new_header_id = context->TakeNextId();
  if (new_header_id == 0) {
    return nullptr;
  }

  // Find the insertion point for the new bb.
  Function::iterator header_it = std::find_if(
      fn->begin(), fn->end(),
      [bb](BasicBlock& block_in_func) { return &block_in_func == bb; });
  assert(header_it != fn->end());

  const std::vector<uint32_t>& pred = preds(bb->id());
  // Find the back edge
  BasicBlock* latch_block = nullptr;
  Function::iterator latch_block_iter = header_it;
  for (; latch_block_iter != fn->end(); ++latch_block_iter) {
    // If blocks are in the proper order, then the only branch that appears
    // after the header is the latch.
    if (std::find(pred.begin(), pred.end(), latch_block_iter->id()) !=
        pred.end()) {
      break;
    }
  }
  assert(latch_block_iter != fn->end() && "Could not find the latch.");
  latch_block = &*latch_block_iter;

  RemoveSuccessorEdges(bb);

  // Create the new header bb basic bb.
  // Leave the phi instructions behind.
  auto iter = bb->begin();
  while (iter->opcode() == spv::Op::OpPhi) {
    ++iter;
  }

  BasicBlock* new_header = bb->SplitBasicBlock(context, new_header_id, iter);
  context->AnalyzeDefUse(new_header->GetLabelInst());

  // Update cfg
  RegisterBlock(new_header);

  // Update bb mappings.
  context->set_instr_block(new_header->GetLabelInst(), new_header);
  new_header->ForEachInst([new_header, context](Instruction* inst) {
    context->set_instr_block(inst, new_header);
  });

  // If |bb| was the latch block, the branch back to the header is not in
  // |new_header|.
  if (latch_block == bb) {
    if (new_header->ContinueBlockId() == bb->id()) {
      new_header->GetLoopMergeInst()->SetInOperand(1, {new_header_id});
    }
    latch_block = new_header;
  }

  // Adjust the OpPhi instructions as needed.
  bb->ForEachPhiInst([latch_block, bb, new_header, context](Instruction* phi) {
    std::vector<uint32_t> preheader_phi_ops;
    std::vector<Operand> header_phi_ops;

    // Identify where the original inputs to original OpPhi belong: header or
    // preheader.
    for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
      uint32_t def_id = phi->GetSingleWordInOperand(i);
      uint32_t branch_id = phi->GetSingleWordInOperand(i + 1);
      if (branch_id == latch_block->id()) {
        header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {def_id}});
        header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {branch_id}});
      } else {
        preheader_phi_ops.push_back(def_id);
        preheader_phi_ops.push_back(branch_id);
      }
    }

    // Create a phi instruction if and only if the preheader_phi_ops has more
    // than one pair.
    if (preheader_phi_ops.size() > 2) {
      InstructionBuilder builder(
          context, &*bb->begin(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

      Instruction* new_phi = builder.AddPhi(phi->type_id(), preheader_phi_ops);

      // Add the OpPhi to the header bb.
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {new_phi->result_id()}});
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {bb->id()}});
    } else {
      // An OpPhi with a single entry is just a copy.  In this case use the same
      // instruction in the new header.
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {preheader_phi_ops[0]}});
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {bb->id()}});
    }

    phi->RemoveFromList();
    std::unique_ptr<Instruction> phi_owner(phi);
    phi->SetInOperands(std::move(header_phi_ops));
    new_header->begin()->InsertBefore(std::move(phi_owner));
    context->set_instr_block(phi, new_header);
    context->AnalyzeUses(phi);
  });

  // Add a branch to the new header.
  InstructionBuilder branch_builder(
      context, bb,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  bb->AddInstruction(
      MakeUnique<Instruction>(context, spv::Op::OpBranch, 0, 0,
                              std::initializer_list<Operand>{
                                  {SPV_OPERAND_TYPE_ID, {new_header->id()}}}));
  context->AnalyzeUses(bb->terminator());
  context->set_instr_block(bb->terminator(), bb);
  label2preds_[new_header->id()].push_back(bb->id());

  // Update the latch to branch to the new header.
  latch_block->ForEachSuccessorLabel([bb, new_header_id](uint32_t* id) {
    if (*id == bb->id()) {
      *id = new_header_id;
    }
  });
  Instruction* latch_branch = latch_block->terminator();
  context->AnalyzeUses(latch_branch);
  label2preds_[new_header->id()].push_back(latch_block->id());

  auto& block_preds = label2preds_[bb->id()];
  auto latch_pos =
      std::find(block_preds.begin(), block_preds.end(), latch_block->id());
  assert(latch_pos != block_preds.end() && "The cfg was invalid.");
  block_preds.erase(latch_pos);

  // Update the loop descriptors
  if (context->AreAnalysesValid(IRContext::kAnalysisLoopAnalysis)) {
    LoopDescriptor* loop_desc = context->GetLoopDescriptor(bb->GetParent());
    Loop* loop = (*loop_desc)[bb->id()];

    loop->AddBasicBlock(new_header_id);
    loop->SetHeaderBlock(new_header);
    loop_desc->SetBasicBlockToLoop(new_header_id, loop);

    loop->RemoveBasicBlock(bb->id());
    loop->SetPreHeaderBlock(bb);

    Loop* parent_loop = loop->GetParent();
    if (parent_loop != nullptr) {
      parent_loop->AddBasicBlock(bb->id());
      loop_desc->SetBasicBlockToLoop(bb->id(), parent_loop);
    } else {
      loop_desc->SetBasicBlockToLoop(bb->id(), nullptr);
    }
  }
  return new_header;
}